

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O2

void av1_cdef_fb_row(AV1_COMMON *cm,MACROBLOCKD *xd,uint16_t **linebuf,uint16_t **colbuf,
                    uint16_t *src,int fbr,cdef_init_fb_row_t cdef_init_fb_row_fn,
                    AV1CdefSyncData *cdef_sync,aom_internal_error_info *error_info)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint16_t *puVar3;
  int mi_row;
  int iVar4;
  int iVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  int mi_col;
  int sstride;
  uint8_t *dst8;
  uint16_t *puVar14;
  uint16_t uVar15;
  int iVar16;
  uint16_t *puVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int cdef_left [3];
  int level [2];
  CdefBlockInfo fb_info;
  
  cdef_left[0] = 1;
  cdef_left[1] = 1;
  cdef_left[2] = 1;
  iVar20 = ((cm->mi_params).mi_cols + 0xf) / 0x10;
  (*cdef_init_fb_row_fn)(cm,xd,&fb_info,linebuf,src,cdef_sync,fbr);
  if ((cdef_sync != (AV1CdefSyncData *)0x0) && (1 < (cm->cdef_info).allocated_num_workers)) {
    pthread_mutex_lock((pthread_mutex_t *)cdef_sync->mutex_);
    _Var1 = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock((pthread_mutex_t *)cdef_sync->mutex_);
    if (_Var1 != false) {
      return;
    }
  }
  mi_row = fbr * 0x10;
  iVar24 = 0;
  iVar21 = iVar20;
  if (iVar20 < 1) {
    iVar21 = 0;
  }
  do {
    if (iVar24 == iVar21) {
      return;
    }
    fb_info.frame_boundary[1] = (int)(iVar24 == 0);
    if (iVar24 == iVar20 + -1) {
      fb_info.frame_boundary[3] = 1;
      mi_col = iVar24 << 4;
    }
    else {
      mi_col = iVar24 * 0x10;
      fb_info.frame_boundary[3] = (int)(mi_col + 0x10 == (cm->mi_params).mi_cols);
    }
    uVar18 = (int)(short)(*(short *)&(cm->mi_params).mi_grid_base
                                     [(cm->mi_params).mi_stride * mi_row + mi_col]->field_0xa7 * 2)
             & 0xff000;
    uVar2 = cm->seq_params->monochrome;
    uVar12 = (uint)(uVar2 == '\0') * 2 + 1;
    level[0] = 0;
    level[1] = 0;
    if (uVar18 == 0xff000) {
LAB_0032f1c8:
      memset(cdef_left,0,(ulong)(uVar12 * 4));
    }
    else {
      iVar4 = (int)(uVar18 << 0xc) >> 0x18;
      iVar10 = (cm->cdef_info).cdef_strengths[iVar4];
      iVar9 = iVar10 % 4;
      if (iVar10 % 4 == 3) {
        iVar9 = 4;
      }
      level[1] = 0;
      level[0] = iVar10 / 4;
      bVar6 = true;
      if (uVar2 == '\0') {
        iVar4 = (cm->cdef_info).cdef_uv_strengths[iVar4];
        level[1] = iVar4 / 4;
        iVar13 = iVar4 % 4;
        if (iVar4 % 4 == 3) {
          iVar13 = 4;
        }
        bVar6 = iVar13 == 0 && iVar4 + 3U < 7;
      }
      if ((iVar10 + 3U < 7 && iVar9 == 0) && bVar6) goto LAB_0032f1c8;
      fb_info.cdef_count =
           av1_cdef_compute_sb_list(&cm->mi_params,mi_row,mi_col,fb_info.dlist,BLOCK_64X64);
      if (fb_info.cdef_count == 0) goto LAB_0032f1c8;
      piVar11 = &xd->plane[0].subsampling_x;
      for (uVar19 = 0; puVar14 = fb_info.src, uVar12 != uVar19; uVar19 = uVar19 + 1) {
        if ((uVar19 == 0) || (!bVar6)) {
          fb_info.level = level[uVar19 != 0];
          fb_info.sec_strength = level[(ulong)(uVar19 != 0) - 2];
          fb_info.dst = ((buf_2d *)(piVar11 + 3))->buf;
          fb_info.dst_stride = piVar11[9];
          fb_info.xdec = *piVar11;
          fb_info.ydec = piVar11[1];
          fb_info.mi_wide_l2 = 2 - *piVar11;
          fb_info.mi_high_l2 = 2 - piVar11[1];
          bVar7 = (byte)fb_info.mi_high_l2;
          fb_info.roffset = mi_row << (bVar7 & 0x1f);
          uVar15 = (uint16_t)fb_info.roffset;
          bVar8 = (byte)fb_info.mi_wide_l2;
          fb_info.coffset = mi_col << (bVar8 & 0x1f);
          iVar10 = cdef_left[uVar19];
          iVar9 = (cm->mi_params).mi_rows;
          iVar4 = (cm->mi_params).mi_cols;
          iVar13 = iVar4 - mi_col;
          if (0xf < iVar4 - mi_col) {
            iVar13 = 0x10;
          }
          iVar23 = iVar9 + fbr * -0x10;
          if (0xf < iVar23) {
            iVar23 = 0x10;
          }
          iVar13 = iVar13 << (bVar8 & 0x1f);
          iVar23 = iVar23 << (bVar7 & 0x1f);
          if (uVar19 == 0) {
            bVar7 = 0;
          }
          else {
            bVar7 = (byte)cm->seq_params->subsampling_x;
          }
          puVar3 = fb_info.top_linebuf[uVar19];
          sstride = (int)(iVar4 * 4 + 0xfU & 0xfffffff0) >> (bVar7 & 0x1f);
          puVar17 = fb_info.bot_linebuf[uVar19];
          iVar16 = (iVar4 + 0xf) / 0x10 + -1;
          iVar4 = iVar13;
          if (iVar16 != iVar24) {
            iVar4 = iVar13 + 8;
          }
          uVar18 = (iVar23 + 2) * 0x90;
          iVar5 = (uint)(iVar10 != 0) * 8 + -8;
          iVar22 = (iVar9 + 0xf) / 0x10 + -1;
          av1_cdef_copy_sb8_16
                    (cm,fb_info.src + (long)iVar5 + 0x128,0x90,((buf_2d *)(piVar11 + 3))->buf,
                     fb_info.roffset,fb_info.coffset + iVar5,piVar11[9],iVar23,iVar4 - iVar5);
          iVar9 = iVar23;
          if (iVar22 != fbr) {
            iVar9 = iVar23 + 2;
          }
          if (fbr < iVar22) {
            uVar15 = 2;
            iVar4 = sstride;
            copy_rect(puVar14 + (int)(uVar18 | 8),0x90,puVar17 + fb_info.coffset,sstride,2,iVar13);
            if (iVar24 == 0) goto LAB_0032ee93;
            uVar15 = 2;
            iVar4 = sstride;
            copy_rect(puVar14 + (int)uVar18,0x90,puVar17 + (long)fb_info.coffset + -8,sstride,2,8);
          }
          else {
            iVar4 = iVar9;
            fill_rect(puVar14 + (int)(uVar18 | 8),2,iVar13,iVar9,uVar15);
LAB_0032ee93:
            fill_rect(puVar14 + (int)uVar18,2,8,iVar4,uVar15);
          }
          if ((iVar24 < iVar16) && (fbr < iVar22)) {
            uVar15 = 2;
            iVar4 = sstride;
            copy_rect(puVar14 + (long)(int)(uVar18 + iVar13) + 8,0x90,
                      puVar17 + (long)fb_info.coffset + (long)iVar13,sstride,2,8);
          }
          else {
            fill_rect(puVar14 + (long)(int)(uVar18 + iVar13) + 8,2,8,iVar4,uVar15);
          }
          if (fbr < 1) {
            fill_rect(puVar14 + 8,2,iVar13,iVar4,uVar15);
LAB_0032ef75:
            fill_rect(puVar14,2,8,iVar4,uVar15);
          }
          else {
            uVar15 = 2;
            iVar4 = sstride;
            copy_rect(puVar14 + 8,0x90,puVar3 + fb_info.coffset,sstride,2,iVar13);
            if (iVar24 == 0) goto LAB_0032ef75;
            uVar15 = 2;
            iVar4 = sstride;
            copy_rect(puVar14,0x90,puVar3 + (long)fb_info.coffset + -8,sstride,2,8);
          }
          puVar17 = puVar14 + (long)iVar13 + 8;
          if ((fbr < 1) || (iVar16 <= iVar24)) {
            fill_rect(puVar17,2,8,iVar4,uVar15);
          }
          else {
            copy_rect(puVar17,0x90,puVar3 + (long)fb_info.coffset + (long)iVar13,sstride,2,8);
          }
          if (iVar10 != 0) {
            copy_rect(puVar14,0x90,colbuf[uVar19],8,iVar9 + 2,8);
          }
          uVar15 = (uint16_t)(iVar9 + 2);
          iVar10 = 0x90;
          copy_rect(colbuf[uVar19],8,puVar14 + iVar13,0x90,iVar9 + 2,8);
          if (fb_info.frame_boundary[1] != 0) {
            fill_rect(puVar14,iVar23 + 4,8,iVar10,uVar15);
          }
          if (fb_info.frame_boundary[3] != 0) {
            fill_rect(puVar17,iVar23 + 4,8,iVar10,uVar15);
          }
          dst8 = fb_info.dst +
                 (long)fb_info.coffset + (long)fb_info.roffset * (long)fb_info.dst_stride;
          if (cm->seq_params->use_highbitdepth == '\0') {
            puVar14 = (uint16_t *)0x0;
          }
          else {
            puVar14 = (uint16_t *)((long)dst8 * 2);
            dst8 = (uint8_t *)0x0;
          }
          av1_cdef_filter_fb(dst8,puVar14,fb_info.dst_stride,fb_info.src + 0x128,fb_info.xdec,
                             fb_info.ydec,fb_info.dir,(int *)0x0,fb_info.var,(int)uVar19,
                             fb_info.dlist,fb_info.cdef_count,fb_info.level,fb_info.sec_strength,
                             fb_info.damping,fb_info.coeff_shift);
          cdef_left[uVar19] = 1;
        }
        else {
          cdef_left[uVar19] = 0;
        }
        piVar11 = piVar11 + 0x28c;
      }
    }
    iVar24 = iVar24 + 1;
  } while( true );
}

Assistant:

void av1_cdef_fb_row(const AV1_COMMON *const cm, MACROBLOCKD *xd,
                     uint16_t **const linebuf, uint16_t **const colbuf,
                     uint16_t *const src, int fbr,
                     cdef_init_fb_row_t cdef_init_fb_row_fn,
                     struct AV1CdefSyncData *const cdef_sync,
                     struct aom_internal_error_info *error_info) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  CdefBlockInfo fb_info;
  int cdef_left[MAX_MB_PLANE] = { 1, 1, 1 };
  const int nhfb = (cm->mi_params.mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  cdef_init_fb_row_fn(cm, xd, &fb_info, linebuf, src, cdef_sync, fbr);
#if CONFIG_MULTITHREAD
  if (cdef_sync && cm->cdef_info.allocated_num_workers > 1) {
    pthread_mutex_lock(cdef_sync->mutex_);
    const bool cdef_mt_exit = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock(cdef_sync->mutex_);
    // Exit in case any worker has encountered an error.
    if (cdef_mt_exit) return;
  }
#endif
  for (int fbc = 0; fbc < nhfb; fbc++) {
    fb_info.frame_boundary[LEFT] = (MI_SIZE_64X64 * fbc == 0) ? 1 : 0;
    if (fbc != nhfb - 1)
      fb_info.frame_boundary[RIGHT] =
          (MI_SIZE_64X64 * (fbc + 1) == cm->mi_params.mi_cols) ? 1 : 0;
    else
      fb_info.frame_boundary[RIGHT] = 1;
    cdef_fb_col(cm, xd, &fb_info, colbuf, &cdef_left[0], fbc, fbr);
  }
}